

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O0

_Bool do_install_audio(ALLEGRO_AUDIO_DRIVER_ENUM mode)

{
  int iVar1;
  ulong uVar2;
  char *string;
  ALLEGRO_AUDIO_DRIVER_ENUM in_EDI;
  _Bool retVal;
  char *in_stack_ffffffffffffffe8;
  ALLEGRO_AUDIO_DRIVER_ENUM in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  undefined4 uVar3;
  ALLEGRO_AUDIO_DRIVER_ENUM local_8;
  _Bool local_1;
  
  if (_al_kcm_driver == (ALLEGRO_AUDIO_DRIVER *)0x0) {
    local_8 = in_EDI;
    if (in_EDI == ALLEGRO_AUDIO_DRIVER_AUTODETECT) {
      local_8 = get_config_audio_driver();
    }
    string = (char *)(ulong)(local_8 - ALLEGRO_AUDIO_DRIVER_AUTODETECT);
    switch(string) {
    case (char *)0x0:
      local_1 = do_install_audio(in_stack_fffffffffffffff0);
      uVar3 = CONCAT13(local_1,(int3)in_stack_fffffffffffffff4);
      if (!local_1) {
        local_1 = do_install_audio(in_stack_fffffffffffffff0);
        uVar3 = CONCAT13(local_1,(int3)uVar3);
        if (!local_1) {
          local_1 = do_install_audio(in_stack_fffffffffffffff0);
          if (!local_1) {
            _al_set_error(CONCAT13(local_1,(int3)uVar3),string);
            _al_kcm_driver = (ALLEGRO_AUDIO_DRIVER *)0x0;
            local_1 = false;
          }
        }
      }
      break;
    case (char *)0x1:
      _al_set_error(in_stack_fffffffffffffff4,string);
      local_1 = false;
      break;
    case (char *)0x2:
      iVar1 = (*_al_kcm_alsa_driver.open)();
      if (iVar1 == 0) {
        uVar2 = _al_trace_prefix(__al_debug_channel,1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio.c"
                                 ,0x134,"do_install_audio");
        if ((uVar2 & 1) != 0) {
          _al_trace_suffix("Using ALSA driver\n");
        }
        _al_kcm_driver = &_al_kcm_alsa_driver;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      break;
    case (char *)0x3:
      _al_set_error(in_stack_fffffffffffffff4,string);
      local_1 = false;
      break;
    case (char *)0x4:
      iVar1 = (*_al_kcm_oss_driver.open)();
      if (iVar1 == 0) {
        uVar2 = _al_trace_prefix(__al_debug_channel,1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio.c"
                                 ,0x141,"do_install_audio");
        if ((uVar2 & 1) != 0) {
          _al_trace_suffix("Using OSS driver\n");
        }
        _al_kcm_driver = &_al_kcm_oss_driver;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      break;
    case (char *)0x5:
      _al_set_error(in_stack_fffffffffffffff4,string);
      local_1 = false;
      break;
    case (char *)0x6:
      iVar1 = (*_al_kcm_pulseaudio_driver.open)();
      if (iVar1 == 0) {
        uVar2 = _al_trace_prefix(__al_debug_channel,1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio.c"
                                 ,0x14e,"do_install_audio");
        if ((uVar2 & 1) != 0) {
          _al_trace_suffix("Using PulseAudio driver\n");
        }
        _al_kcm_driver = &_al_kcm_pulseaudio_driver;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      break;
    case (char *)0x7:
      _al_set_error(in_stack_fffffffffffffff4,string);
      local_1 = false;
      break;
    case (char *)0x8:
      _al_set_error(in_stack_fffffffffffffff4,string);
      local_1 = false;
      break;
    default:
      _al_set_error(in_stack_fffffffffffffff4,string);
      local_1 = false;
    }
  }
  else {
    _al_set_error(in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8);
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool do_install_audio(ALLEGRO_AUDIO_DRIVER_ENUM mode)
{
   bool retVal;

   /* check to see if a driver is already installed and running */
   if (_al_kcm_driver) {
      _al_set_error(ALLEGRO_GENERIC_ERROR, "A driver already running");
      return false;
   }

   if (mode == ALLEGRO_AUDIO_DRIVER_AUTODETECT) {
      mode = get_config_audio_driver();
   }

   switch (mode) {
      case ALLEGRO_AUDIO_DRIVER_AUTODETECT:
#if defined(ALLEGRO_SDL)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_SDL);
         if (retVal)
            return retVal;
#endif
#if defined(ALLEGRO_CFG_KCM_AQUEUE)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_AQUEUE);
         if (retVal)
            return retVal;
#endif
/* If a PA server is running, we should use it by default as it will
 * hijack ALSA and OSS and using those then just means extra lag.
 * 
 * FIXME: Detect if no PA server is running and in that case prefer
 * ALSA and OSS first.
 */
#if defined(ALLEGRO_CFG_KCM_PULSEAUDIO)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_PULSEAUDIO);
         if (retVal)
            return retVal;
#endif
#if defined(ALLEGRO_CFG_KCM_ALSA)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_ALSA);
         if (retVal)
            return retVal;
#endif
#if defined(ALLEGRO_CFG_KCM_DSOUND)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_DSOUND);
         if (retVal)
            return retVal;
#endif
#if defined(ALLEGRO_CFG_KCM_OSS)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_OSS);
         if (retVal)
            return retVal;
#endif
#if defined(ALLEGRO_CFG_KCM_OPENAL)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_OPENAL);
         if (retVal)
            return retVal;
#endif
#if defined(ALLEGRO_CFG_KCM_OPENSL)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_OPENSL);
         if (retVal)
            return retVal;
#endif

         _al_set_error(ALLEGRO_INVALID_PARAM, "No audio driver can be used.");
         _al_kcm_driver = NULL;
         return false;

      case ALLEGRO_AUDIO_DRIVER_AQUEUE:
         #if defined(ALLEGRO_CFG_KCM_AQUEUE)
            if (_al_kcm_aqueue_driver.open() == 0) {
               ALLEGRO_INFO("Using Apple Audio Queue driver\n"); 
               _al_kcm_driver = &_al_kcm_aqueue_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "Audio Queue driver not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_OPENAL:
         #if defined(ALLEGRO_CFG_KCM_OPENAL)
            if (_al_kcm_openal_driver.open() == 0) {
               ALLEGRO_INFO("Using OpenAL driver\n"); 
               _al_kcm_driver = &_al_kcm_openal_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "OpenAL not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_OPENSL:
         #if defined(ALLEGRO_CFG_KCM_OPENSL)
            if (_al_kcm_opensl_driver.open() == 0) {
               ALLEGRO_INFO("Using OpenSL driver\n"); 
               _al_kcm_driver = &_al_kcm_opensl_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "OpenSL not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_ALSA:
         #if defined(ALLEGRO_CFG_KCM_ALSA)
            if (_al_kcm_alsa_driver.open() == 0) {
               ALLEGRO_INFO("Using ALSA driver\n"); 
               _al_kcm_driver = &_al_kcm_alsa_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "ALSA not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_OSS:
         #if defined(ALLEGRO_CFG_KCM_OSS)
            if (_al_kcm_oss_driver.open() == 0) {
               ALLEGRO_INFO("Using OSS driver\n");
               _al_kcm_driver = &_al_kcm_oss_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "OSS not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_PULSEAUDIO:
         #if defined(ALLEGRO_CFG_KCM_PULSEAUDIO)
            if (_al_kcm_pulseaudio_driver.open() == 0) {
               ALLEGRO_INFO("Using PulseAudio driver\n");
               _al_kcm_driver = &_al_kcm_pulseaudio_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "PulseAudio not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_DSOUND:
         #if defined(ALLEGRO_CFG_KCM_DSOUND)
            if (_al_kcm_dsound_driver.open() == 0) {
               ALLEGRO_INFO("Using DirectSound driver\n"); 
               _al_kcm_driver = &_al_kcm_dsound_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "DirectSound not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_SDL:
         #if defined(ALLEGRO_SDL)
            if (_al_kcm_sdl_driver.open() == 0) {
               ALLEGRO_INFO("Using SDL driver\n");
               _al_kcm_driver = &_al_kcm_sdl_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "SDL not available on this platform");
            return false;
         #endif

      default:
         _al_set_error(ALLEGRO_INVALID_PARAM, "Invalid audio driver");
         return false;
   }
}